

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UserDefinedNetDeclarationSyntax::setChild
          (UserDefinedNetDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  TimingControlSyntax *local_148;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  Info *local_40;
  TimingControlSyntax *local_38;
  TimingControlSyntax *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  UserDefinedNetDeclarationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->netType).kind = (undefined2)local_28;
    (this->netType).field_0x2 = local_28._2_1_;
    (this->netType).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->netType).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->netType).info = local_20;
    break;
  case 2:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_148 = (TimingControlSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::TimingControlSyntax>(pSVar2);
    }
    local_38 = local_148;
    not_null<slang::syntax::TimingControlSyntax*>::
    not_null<slang::syntax::TimingControlSyntax*,void>
              ((not_null<slang::syntax::TimingControlSyntax*> *)&local_30,&local_38);
    (this->delay).ptr = local_30;
    break;
  case 3:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>>
                       (pSVar2);
    SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::operator=(&this->declarators,pSVar3);
    break;
  case 4:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar4._0_8_;
    (this->semi).kind = (undefined2)local_48;
    (this->semi).field_0x2 = local_48._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->semi).rawLen = local_48._4_4_;
    local_40 = TVar4.info;
    (this->semi).info = local_40;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_e9);
    std::operator+(&local_c8,&local_e8,":");
    std::__cxx11::to_string(&local_120,0x3561);
    std::operator+(&local_a8,&local_c8,&local_120);
    std::operator+(&local_88,&local_a8,": ");
    std::operator+(&local_68,&local_88,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void UserDefinedNetDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: netType = child.token(); return;
        case 2: delay = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 3: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}